

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

stbtt_int32 stbtt__GetGlyphClass(stbtt_uint8 *classDefTable,int glyph)

{
  long lVar1;
  bool bVar2;
  ushort uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  
  uVar3 = *(ushort *)classDefTable << 8 | *(ushort *)classDefTable >> 8;
  if (uVar3 == 2) {
    uVar3 = *(ushort *)(classDefTable + 2) << 8 | *(ushort *)(classDefTable + 2) >> 8;
    uVar4 = (uint)uVar3;
    iVar7 = uVar3 - 1;
    iVar9 = 0;
    do {
      iVar8 = iVar9;
      iVar5 = iVar7;
      if (iVar5 < iVar8) break;
      iVar6 = iVar8 + iVar5 >> 1;
      lVar1 = (long)iVar6 * 6;
      iVar9 = iVar8;
      if (glyph < (int)(uint)(ushort)(*(ushort *)(classDefTable + lVar1 + 4) << 8 |
                                     *(ushort *)(classDefTable + lVar1 + 4) >> 8)) {
        bVar2 = true;
        iVar7 = iVar6 + -1;
      }
      else {
        iVar7 = iVar5;
        if ((int)(uint)(ushort)(*(ushort *)(classDefTable + lVar1 + 6) << 8 |
                               *(ushort *)(classDefTable + lVar1 + 6) >> 8) < glyph) {
          bVar2 = true;
          iVar9 = iVar6 + 1;
        }
        else {
          uVar4 = (uint)(ushort)(*(ushort *)(classDefTable + lVar1 + 8) << 8 |
                                *(ushort *)(classDefTable + lVar1 + 8) >> 8);
          bVar2 = false;
        }
      }
    } while (bVar2);
    if (iVar8 <= iVar5) {
      return uVar4;
    }
  }
  else if (uVar3 == 1) {
    uVar3 = *(ushort *)(classDefTable + 2) << 8 | *(ushort *)(classDefTable + 2) >> 8;
    uVar4 = (uint)uVar3;
    bVar2 = true;
    if (((int)(uint)uVar3 <= glyph) &&
       (glyph < (int)((uint)(ushort)(*(ushort *)(classDefTable + 4) << 8 |
                                    *(ushort *)(classDefTable + 4) >> 8) + (uint)uVar3))) {
      uVar4 = (uint)(ushort)(*(ushort *)(classDefTable + (long)(int)(glyph - (uint)uVar3) * 2 + 6)
                             << 8 | *(ushort *)
                                     (classDefTable + (long)(int)(glyph - (uint)uVar3) * 2 + 6) >> 8
                            );
      bVar2 = false;
    }
    if (!bVar2) {
      return uVar4;
    }
  }
  return -1;
}

Assistant:

static stbtt_int32  stbtt__GetGlyphClass(stbtt_uint8 *classDefTable, int glyph)
{
stbtt_uint16 classDefFormat = ttUSHORT(classDefTable);
switch(classDefFormat)
{
case 1: {
stbtt_uint16 startGlyphID = ttUSHORT(classDefTable + 2);
stbtt_uint16 glyphCount = ttUSHORT(classDefTable + 4);
stbtt_uint8 *classDef1ValueArray = classDefTable + 6;

if (glyph >= startGlyphID && glyph < startGlyphID + glyphCount)
return (stbtt_int32)ttUSHORT(classDef1ValueArray + 2 * (glyph - startGlyphID));

classDefTable = classDef1ValueArray + 2 * glyphCount;
} break;

case 2: {
stbtt_uint16 classRangeCount = ttUSHORT(classDefTable + 2);
stbtt_uint8 *classRangeRecords = classDefTable + 4;

/*  Binary search. */
stbtt_int32 l=0, r=classRangeCount-1, m;
int strawStart, strawEnd, needle=glyph;
while (l <= r) {
stbtt_uint8 *classRangeRecord;
m = (l + r) >> 1;
classRangeRecord = classRangeRecords + 6 * m;
strawStart = ttUSHORT(classRangeRecord);
strawEnd = ttUSHORT(classRangeRecord + 2);
if (needle < strawStart)
r = m - 1;
else if (needle > strawEnd)
l = m + 1;
else
return (stbtt_int32)ttUSHORT(classRangeRecord + 4);
}

classDefTable = classRangeRecords + 6 * classRangeCount;
} break;

default: {
/*  There are no other cases. */
STBTT_assert(0);
} break;
}

return -1;
}